

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int num;
  uint local_c;
  
  printf("Enter an integer: ");
  __isoc99_scanf("%i",&local_c);
  uVar1 = -local_c;
  if (0 < (int)local_c) {
    uVar1 = local_c;
  }
  printf("The absolute value of %i is %i.\n",(ulong)local_c,(ulong)uVar1);
  return 0;
}

Assistant:

int main() {

    int num;

    printf("Enter an integer: ");
    scanf("%i", &num);

    printf("The absolute value of %i is %i.\n", num, absolute_value(num));

    return 0;
}